

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# md32_common.h
# Opt level: O2

void crypto_md32_final(crypto_md32_block_func block_func,uint32_t *h,uint8_t *data,size_t block_size
                      ,uint *num,uint32_t Nh,uint32_t Nl,int is_big_endian)

{
  uint uVar1;
  ulong uVar2;
  long lVar3;
  uint uVar4;
  
  uVar4 = (uint)num;
  uVar1 = *(uint *)block_size;
  uVar2 = (ulong)uVar1;
  if (0x3f < uVar2) {
    __assert_fail("n < block_size",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/jedisct1[P]boringssl/crypto/fipsmodule/sha/../digest/md32_common.h"
                  ,0x83,
                  "void crypto_md32_final(crypto_md32_block_func, uint32_t *, uint8_t *, size_t, unsigned int *, uint32_t, uint32_t, int)"
                 );
  }
  data[uVar2] = 0x80;
  lVar3 = uVar2 + 1;
  if (uVar1 < 0x38) {
    if (lVar3 == 0x38) goto LAB_001c6614;
  }
  else {
    if (uVar1 != 0x3f) {
      memset(data + lVar3,0,0x3f - uVar2);
    }
    (*block_func)(h,data,1);
    lVar3 = 0;
  }
  memset(data + lVar3,0,0x38 - lVar3);
LAB_001c6614:
  *(uint *)(data + 0x38) =
       uVar4 >> 0x18 | (uVar4 & 0xff0000) >> 8 | (uVar4 & 0xff00) << 8 | uVar4 << 0x18;
  *(uint32_t *)(data + 0x3c) = Nh >> 0x18 | (Nh & 0xff0000) >> 8 | (Nh & 0xff00) << 8 | Nh << 0x18;
  (*block_func)(h,data,1);
  *(undefined4 *)block_size = 0;
  data[0x30] = '\0';
  data[0x31] = '\0';
  data[0x32] = '\0';
  data[0x33] = '\0';
  data[0x34] = '\0';
  data[0x35] = '\0';
  data[0x36] = '\0';
  data[0x37] = '\0';
  data[0x38] = '\0';
  data[0x39] = '\0';
  data[0x3a] = '\0';
  data[0x3b] = '\0';
  data[0x3c] = '\0';
  data[0x3d] = '\0';
  data[0x3e] = '\0';
  data[0x3f] = '\0';
  data[0x20] = '\0';
  data[0x21] = '\0';
  data[0x22] = '\0';
  data[0x23] = '\0';
  data[0x24] = '\0';
  data[0x25] = '\0';
  data[0x26] = '\0';
  data[0x27] = '\0';
  data[0x28] = '\0';
  data[0x29] = '\0';
  data[0x2a] = '\0';
  data[0x2b] = '\0';
  data[0x2c] = '\0';
  data[0x2d] = '\0';
  data[0x2e] = '\0';
  data[0x2f] = '\0';
  data[0x10] = '\0';
  data[0x11] = '\0';
  data[0x12] = '\0';
  data[0x13] = '\0';
  data[0x14] = '\0';
  data[0x15] = '\0';
  data[0x16] = '\0';
  data[0x17] = '\0';
  data[0x18] = '\0';
  data[0x19] = '\0';
  data[0x1a] = '\0';
  data[0x1b] = '\0';
  data[0x1c] = '\0';
  data[0x1d] = '\0';
  data[0x1e] = '\0';
  data[0x1f] = '\0';
  data[0] = '\0';
  data[1] = '\0';
  data[2] = '\0';
  data[3] = '\0';
  data[4] = '\0';
  data[5] = '\0';
  data[6] = '\0';
  data[7] = '\0';
  data[8] = '\0';
  data[9] = '\0';
  data[10] = '\0';
  data[0xb] = '\0';
  data[0xc] = '\0';
  data[0xd] = '\0';
  data[0xe] = '\0';
  data[0xf] = '\0';
  return;
}

Assistant:

static inline void crypto_md32_final(crypto_md32_block_func block_func,
                                     uint32_t *h, uint8_t *data,
                                     size_t block_size, unsigned *num,
                                     uint32_t Nh, uint32_t Nl,
                                     int is_big_endian) {
  // |data| always has room for at least one byte. A full block would have
  // been consumed.
  size_t n = *num;
  assert(n < block_size);
  data[n] = 0x80;
  n++;

  // Fill the block with zeros if there isn't room for a 64-bit length.
  if (n > block_size - 8) {
    OPENSSL_memset(data + n, 0, block_size - n);
    n = 0;
    block_func(h, data, 1);
  }
  OPENSSL_memset(data + n, 0, block_size - 8 - n);

  // Append a 64-bit length to the block and process it.
  if (is_big_endian) {
    CRYPTO_store_u32_be(data + block_size - 8, Nh);
    CRYPTO_store_u32_be(data + block_size - 4, Nl);
  } else {
    CRYPTO_store_u32_le(data + block_size - 8, Nl);
    CRYPTO_store_u32_le(data + block_size - 4, Nh);
  }
  block_func(h, data, 1);
  *num = 0;
  OPENSSL_memset(data, 0, block_size);
}